

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRendererSDL.cpp
# Opt level: O3

string * __thiscall
ImGuiRendererSDL::loadTextureFromFile
          (string *__return_storage_ptr__,ImGuiRendererSDL *this,path *filepath,GLuint *out_texture,
          int *out_width,int *out_height)

{
  pointer pcVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  GLenum __val;
  uchar *__ptr;
  undefined8 *puVar7;
  long *plVar8;
  uint uVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  _func_int_void_ptr_char_ptr_int *p_Var13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  uint uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  long local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  int glMaxTextureSize;
  GLuint image_texture;
  long local_1b0;
  _func_int_void_ptr_char_ptr_int *local_1a8 [2];
  string *local_198;
  string local_190;
  GLsizei local_16c;
  int image_height;
  int image_width;
  string __str;
  string error_msg;
  vector<char,_std::allocator<char>_> buf;
  undefined1 local_108 [48];
  int local_d8;
  stbi_uc *local_50;
  stbi_uc *local_48;
  stbi_uc *local_40;
  stbi_uc *local_38;
  
  image_width = 0;
  image_height = 0;
  error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
  error_msg._M_string_length = 0;
  error_msg.field_2._M_local_buf[0] = '\0';
  file_as_buffer(&buf,filepath,&error_msg);
  if ((buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       == buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) || (error_msg._M_string_length != 0)) {
    pcVar1 = (filepath->_M_pathname)._M_dataplus._M_p;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,pcVar1,pcVar1 + (filepath->_M_pathname)._M_string_length);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_108._16_8_ = *puVar10;
      local_108._24_8_ = puVar7[3];
      local_108._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_108 + 0x10);
    }
    else {
      local_108._16_8_ = *puVar10;
      local_108._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar7;
    }
    local_108._8_8_ = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append(local_108,(ulong)error_msg._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar11) {
      lVar4 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
    local_190.field_2._M_allocated_capacity = local_200.field_2._M_allocated_capacity;
    _Var15._M_p = local_200._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p == &local_200.field_2) goto LAB_00152476;
  }
  else {
    local_108._16_8_ = (_func_int_void_ptr_char_ptr_int *)0x0;
    local_d8 = 0;
    local_40 = (stbi_uc *)
               buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_50 = (stbi_uc *)
               buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_48 = (stbi_uc *)
               (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_start +
               ((int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start));
    local_198 = __return_storage_ptr__;
    local_38 = local_48;
    __ptr = stbi__load_and_postprocess_8bit
                      ((stbi__context *)local_108,&image_width,&image_height,(int *)0x0,4);
    if (__ptr == (uchar *)0x0) {
      pcVar1 = (filepath->_M_pathname)._M_dataplus._M_p;
      local_1e0 = &local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,pcVar1,pcVar1 + (filepath->_M_pathname)._M_string_length);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,0x1efaec)
      ;
      __return_storage_ptr__ = local_198;
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      puVar10 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_200.field_2._M_allocated_capacity = *puVar10;
        local_200.field_2._8_8_ = puVar7[3];
      }
      else {
        local_200.field_2._M_allocated_capacity = *puVar10;
        local_200._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_200._M_string_length = puVar7[1];
      *puVar7 = puVar10;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
      puVar10 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_108._16_8_ = *puVar10;
        local_108._24_8_ = puVar7[3];
        local_108._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_108 + 0x10);
      }
      else {
        local_108._16_8_ = *puVar10;
        local_108._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar7;
      }
      local_108._8_8_ = puVar7[1];
      *puVar7 = puVar10;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append(local_108);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        lVar4 = plVar8[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      }
      __return_storage_ptr__->_M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_190.field_2._M_allocated_capacity = local_108._16_8_;
      _Var15._M_p = (pointer)local_108._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_108 + 0x10)) {
LAB_00151cee:
        operator_delete(_Var15._M_p,(ulong)(local_190.field_2._M_allocated_capacity + 1));
      }
LAB_00151cf6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,
                        (ulong)(local_200.field_2._M_allocated_capacity + 1));
      }
      local_190.field_2._M_allocated_capacity = local_1d0._M_allocated_capacity;
      _Var15._M_p = (pointer)local_1e0;
      if (local_1e0 == &local_1d0) goto LAB_00152476;
    }
    else {
      (*glad_glGetIntegerv)(0xd33,&glMaxTextureSize);
      iVar5 = image_width;
      cVar3 = (char)(image_width >> 0x1f);
      if (glMaxTextureSize < image_width) {
        pcVar1 = (filepath->_M_pathname)._M_dataplus._M_p;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,pcVar1,pcVar1 + (filepath->_M_pathname)._M_string_length);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
        puVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_1d0._M_allocated_capacity = *puVar10;
          local_1d0._8_8_ = puVar7[3];
          local_1e0 = &local_1d0;
        }
        else {
          local_1d0._M_allocated_capacity = *puVar10;
          local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
        }
        local_1d8 = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        uVar2 = -iVar5;
        if (0 < iVar5) {
          uVar2 = iVar5;
        }
        uVar16 = 1;
        if (9 < uVar2) {
          uVar12 = (ulong)uVar2;
          uVar6 = 4;
          do {
            uVar16 = uVar6;
            uVar9 = (uint)uVar12;
            if (uVar9 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_00151eda;
            }
            if (uVar9 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_00151eda;
            }
            if (uVar9 < 10000) goto LAB_00151eda;
            uVar12 = uVar12 / 10000;
            uVar6 = uVar16 + 4;
          } while (99999 < uVar9);
          uVar16 = uVar16 + 1;
        }
LAB_00151eda:
        _image_texture = local_1a8;
        std::__cxx11::string::_M_construct((ulong)&image_texture,(char)uVar16 - cVar3);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)((uint)iVar5 >> 0x1f) + (long)_image_texture),uVar16,uVar2);
        uVar14 = (_func_int_void_ptr_char_ptr_int *)0xf;
        if (local_1e0 != &local_1d0) {
          uVar14 = local_1d0._M_allocated_capacity;
        }
        if ((ulong)uVar14 < (_func_int_void_ptr_char_ptr_int *)(local_1b0 + local_1d8)) {
          p_Var13 = (_func_int_void_ptr_char_ptr_int *)0xf;
          if (_image_texture != local_1a8) {
            p_Var13 = local_1a8[0];
          }
          if (p_Var13 < (_func_int_void_ptr_char_ptr_int *)(local_1b0 + local_1d8))
          goto LAB_00151f4d;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&image_texture,0,(char *)0x0,(ulong)local_1e0);
        }
        else {
LAB_00151f4d:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)_image_texture);
        }
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        puVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_200.field_2._M_allocated_capacity = *puVar10;
          local_200.field_2._8_8_ = puVar7[3];
        }
        else {
          local_200.field_2._M_allocated_capacity = *puVar10;
          local_200._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_200._M_string_length = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)puVar10 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
        puVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_108._16_8_ = *puVar10;
          local_108._24_8_ = puVar7[3];
          local_108._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_108 + 0x10);
        }
        else {
          local_108._16_8_ = *puVar10;
          local_108._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar7;
        }
        local_108._8_8_ = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        uVar2 = -glMaxTextureSize;
        if (0 < glMaxTextureSize) {
          uVar2 = glMaxTextureSize;
        }
        uVar16 = 1;
        if (9 < uVar2) {
          uVar12 = (ulong)uVar2;
          uVar6 = 4;
          do {
            uVar16 = uVar6;
            uVar9 = (uint)uVar12;
            if (uVar9 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_00152075;
            }
            if (uVar9 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_00152075;
            }
            if (uVar9 < 10000) goto LAB_00152075;
            uVar12 = uVar12 / 10000;
            uVar6 = uVar16 + 4;
          } while (99999 < uVar9);
          uVar16 = uVar16 + 1;
        }
LAB_00152075:
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&__str,(char)uVar16 - (char)(glMaxTextureSize >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p + ((uint)glMaxTextureSize >> 0x1f),uVar16,uVar2);
        __return_storage_ptr__ = local_198;
        p_Var13 = (_func_int_void_ptr_char_ptr_int *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_108 + 0x10)) {
          p_Var13 = (_func_int_void_ptr_char_ptr_int *)local_108._16_8_;
        }
        if (p_Var13 < (_func_int_void_ptr_char_ptr_int *)(__str._M_string_length + local_108._8_8_))
        {
          uVar14 = (_func_int_void_ptr_char_ptr_int *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            uVar14 = __str.field_2._M_allocated_capacity;
          }
          if ((_func_int_void_ptr_char_ptr_int *)(__str._M_string_length + local_108._8_8_) <=
              (ulong)uVar14) {
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,local_108._0_8_);
            goto LAB_0015238b;
          }
        }
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append(local_108,(ulong)__str._M_dataplus._M_p);
      }
      else {
        if (image_height <= glMaxTextureSize) {
          local_16c = image_height;
          (*glad_glGenTextures)(1,&image_texture);
          (*glad_glBindTexture)(0xde1,image_texture);
          (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
          (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
          (*glad_glPixelStorei)(0xcf2,0);
          (*glad_glTexImage2D)(0xde1,0,0x1908,iVar5,local_16c,0,0x1908,0x1401,__ptr);
          __val = (*glad_glGetError)();
          if (__val == 0) {
            free(__ptr);
            *out_texture = image_texture;
            *out_width = iVar5;
            *out_height = local_16c;
            (local_198->_M_dataplus)._M_p = (pointer)&local_198->field_2;
            local_198->_M_string_length = 0;
            (local_198->field_2)._M_local_buf[0] = '\0';
            __return_storage_ptr__ = local_198;
            goto LAB_00152476;
          }
          if (__val == 0x505) {
            pcVar1 = (filepath->_M_pathname)._M_dataplus._M_p;
            local_108._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_108 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_108,pcVar1,pcVar1 + (filepath->_M_pathname)._M_string_length)
            ;
            __return_storage_ptr__ = local_198;
            std::operator+(local_198,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108,": image too large to fit in the GPU memory.");
            local_190.field_2._M_allocated_capacity = local_108._16_8_;
            _Var15._M_p = (pointer)local_108._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_108 + 0x10)) goto LAB_00152476;
            goto LAB_0015246e;
          }
          pcVar1 = (filepath->_M_pathname)._M_dataplus._M_p;
          local_1e0 = &local_1d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e0,pcVar1,pcVar1 + (filepath->_M_pathname)._M_string_length);
          __return_storage_ptr__ = local_198;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          puVar10 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_200.field_2._M_allocated_capacity = *puVar10;
            local_200.field_2._8_8_ = puVar7[3];
          }
          else {
            local_200.field_2._M_allocated_capacity = *puVar10;
            local_200._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_200._M_string_length = puVar7[1];
          *puVar7 = puVar10;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          std::__cxx11::to_string(&local_190,__val);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&local_200,&local_190);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108," when loading the image into GPU memory.");
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
          }
          _Var15._M_p = local_190._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) goto LAB_00151cee;
          goto LAB_00151cf6;
        }
        pcVar1 = (filepath->_M_pathname)._M_dataplus._M_p;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,pcVar1,pcVar1 + (filepath->_M_pathname)._M_string_length);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
        puVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_1d0._M_allocated_capacity = *puVar10;
          local_1d0._8_8_ = puVar7[3];
          local_1e0 = &local_1d0;
        }
        else {
          local_1d0._M_allocated_capacity = *puVar10;
          local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
        }
        local_1d8 = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        uVar2 = -iVar5;
        if (0 < iVar5) {
          uVar2 = iVar5;
        }
        uVar16 = 1;
        if (9 < uVar2) {
          uVar12 = (ulong)uVar2;
          uVar6 = 4;
          do {
            uVar16 = uVar6;
            uVar9 = (uint)uVar12;
            if (uVar9 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_0015213b;
            }
            if (uVar9 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_0015213b;
            }
            if (uVar9 < 10000) goto LAB_0015213b;
            uVar12 = uVar12 / 10000;
            uVar6 = uVar16 + 4;
          } while (99999 < uVar9);
          uVar16 = uVar16 + 1;
        }
LAB_0015213b:
        _image_texture = local_1a8;
        std::__cxx11::string::_M_construct((ulong)&image_texture,(char)uVar16 - cVar3);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)((uint)iVar5 >> 0x1f) + (long)_image_texture),uVar16,uVar2);
        uVar14 = (_func_int_void_ptr_char_ptr_int *)0xf;
        if (local_1e0 != &local_1d0) {
          uVar14 = local_1d0._M_allocated_capacity;
        }
        if ((ulong)uVar14 < (_func_int_void_ptr_char_ptr_int *)(local_1b0 + local_1d8)) {
          p_Var13 = (_func_int_void_ptr_char_ptr_int *)0xf;
          if (_image_texture != local_1a8) {
            p_Var13 = local_1a8[0];
          }
          if (p_Var13 < (_func_int_void_ptr_char_ptr_int *)(local_1b0 + local_1d8))
          goto LAB_001521ae;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&image_texture,0,(char *)0x0,(ulong)local_1e0);
        }
        else {
LAB_001521ae:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)_image_texture);
        }
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        puVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_200.field_2._M_allocated_capacity = *puVar10;
          local_200.field_2._8_8_ = puVar7[3];
        }
        else {
          local_200.field_2._M_allocated_capacity = *puVar10;
          local_200._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_200._M_string_length = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)puVar10 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
        puVar10 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_108._16_8_ = *puVar10;
          local_108._24_8_ = puVar7[3];
          local_108._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_108 + 0x10);
        }
        else {
          local_108._16_8_ = *puVar10;
          local_108._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar7;
        }
        local_108._8_8_ = puVar7[1];
        *puVar7 = puVar10;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        uVar2 = -glMaxTextureSize;
        if (0 < glMaxTextureSize) {
          uVar2 = glMaxTextureSize;
        }
        uVar16 = 1;
        if (9 < uVar2) {
          uVar12 = (ulong)uVar2;
          uVar6 = 4;
          do {
            uVar16 = uVar6;
            uVar9 = (uint)uVar12;
            if (uVar9 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_001522d6;
            }
            if (uVar9 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_001522d6;
            }
            if (uVar9 < 10000) goto LAB_001522d6;
            uVar12 = uVar12 / 10000;
            uVar6 = uVar16 + 4;
          } while (99999 < uVar9);
          uVar16 = uVar16 + 1;
        }
LAB_001522d6:
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&__str,(char)uVar16 - (char)(glMaxTextureSize >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p + ((uint)glMaxTextureSize >> 0x1f),uVar16,uVar2);
        __return_storage_ptr__ = local_198;
        p_Var13 = (_func_int_void_ptr_char_ptr_int *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_108 + 0x10)) {
          p_Var13 = (_func_int_void_ptr_char_ptr_int *)local_108._16_8_;
        }
        if (p_Var13 < (_func_int_void_ptr_char_ptr_int *)(__str._M_string_length + local_108._8_8_))
        {
          uVar14 = (_func_int_void_ptr_char_ptr_int *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            uVar14 = __str.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar14 <
              (_func_int_void_ptr_char_ptr_int *)(__str._M_string_length + local_108._8_8_))
          goto LAB_0015236b;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,local_108._0_8_);
        }
        else {
LAB_0015236b:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append(local_108,(ulong)__str._M_dataplus._M_p);
        }
      }
LAB_0015238b:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar11 = puVar7 + 2;
      if ((size_type *)*puVar7 == psVar11) {
        uVar14 = puVar7[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar14;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      }
      __return_storage_ptr__->_M_string_length = puVar7[1];
      *puVar7 = psVar11;
      puVar7[1] = 0;
      *(undefined1 *)psVar11 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,
                        (ulong)(local_200.field_2._M_allocated_capacity + 1));
      }
      if (_image_texture != local_1a8) {
        operator_delete(_image_texture,(ulong)(local_1a8[0] + 1));
      }
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0,(ulong)(local_1d0._M_allocated_capacity + 1));
      }
      _Var15._M_p = local_190._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p == &local_190.field_2) goto LAB_00152476;
    }
  }
LAB_0015246e:
  operator_delete(_Var15._M_p,(ulong)(local_190.field_2._M_allocated_capacity + 1));
LAB_00152476:
  if (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_msg._M_dataplus._M_p != &error_msg.field_2) {
    operator_delete(error_msg._M_dataplus._M_p,
                    CONCAT71(error_msg.field_2._M_allocated_capacity._1_7_,
                             error_msg.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImGuiRendererSDL::loadTextureFromFile(const filesystem::path &filepath, GLuint* out_texture, int* out_width, int* out_height)
{
	// Load from file
	int image_width = 0;
	int image_height = 0;

	std::string error_msg;
	auto buf = file_as_buffer(filepath, error_msg);
	if (buf.empty() || !error_msg.empty()) {
		return filepath.string() + ": " + error_msg;
	}
	unsigned char* image_data = stbi_load_from_memory(reinterpret_cast<unsigned char*>(buf.data()), buf.size(), &image_width, &image_height, NULL, 4);

	if (image_data == nullptr) {
		return "Could not load image from " + filepath.string() + ": " + stbi_failure_reason();
	}

	int glMaxTextureSize;
	glGetIntegerv(GL_MAX_TEXTURE_SIZE, &glMaxTextureSize);
	if (image_width > glMaxTextureSize) {
		return filepath.string() + ": width of " + std::to_string(image_width) + "px is too large for this GPU. Maximum allowed: " + std::to_string(glMaxTextureSize);
	}

	if (image_height > glMaxTextureSize) {
		return filepath.string() + ": height of " + std::to_string(image_width) + "px is too large for this GPU. Maximum allowed: " + std::to_string(glMaxTextureSize);
	}

	// Create a OpenGL texture identifier
	GLuint image_texture;
	glGenTextures(1, &image_texture);
	glBindTexture(GL_TEXTURE_2D, image_texture);

	// Setup filtering parameters for display
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

	// Upload pixels into texture
	glPixelStorei(GL_UNPACK_ROW_LENGTH, 0);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, image_width, image_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, image_data);

	GLenum code = glGetError();
	if (code == GL_OUT_OF_MEMORY) {
		return filepath.string() + ": image too large to fit in the GPU memory.";
	}
	if (code != GL_NO_ERROR) {
		return filepath.string() + ": error " + std::to_string(code) + " when loading the image into GPU memory.";
	}

	stbi_image_free(image_data);

	*out_texture = image_texture;
	*out_width = image_width;
	*out_height = image_height;

	return {};
}